

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O0

HighsDebugStatus
debugCompareHighsInfoInfeasibility
          (HighsOptions *options,HighsInfo *highs_info0,HighsInfo *highs_info1)

{
  HighsDebugStatus status0;
  HighsDebugStatus return_status;
  HighsDebugStatus in_stack_fffffffffffffe80;
  HighsDebugStatus in_stack_fffffffffffffe84;
  undefined8 in_stack_fffffffffffffe88;
  allocator *paVar1;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  string *in_stack_fffffffffffffe98;
  double in_stack_fffffffffffffee0;
  double in_stack_fffffffffffffee8;
  HighsOptions *in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  HighsDebugStatus local_1c;
  
  local_1c = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"num_primal_infeasibility",&local_41);
  debugCompareHighsInfoInteger
            (in_stack_fffffffffffffe98,
             (HighsOptions *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (HighsInt)((ulong)in_stack_fffffffffffffe88 >> 0x20),
             (HighsInt)in_stack_fffffffffffffe88);
  local_1c = debugWorseStatus(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"sum_primal_infeasibility",&local_79);
  debugCompareHighsInfoDouble
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0);
  local_1c = debugWorseStatus(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"max_primal_infeasibility",&local_a1);
  debugCompareHighsInfoDouble
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0);
  local_1c = debugWorseStatus(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"num_dual_infeasibility",&local_c9);
  debugCompareHighsInfoInteger
            (in_stack_fffffffffffffe98,
             (HighsOptions *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (HighsInt)((ulong)in_stack_fffffffffffffe88 >> 0x20),
             (HighsInt)in_stack_fffffffffffffe88);
  local_1c = debugWorseStatus(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  paVar1 = &local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"sum_dual_infeasibility",paVar1);
  debugCompareHighsInfoDouble
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             in_stack_fffffffffffffee0);
  local_1c = debugWorseStatus(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  paVar1 = (allocator *)&stack0xfffffffffffffee7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xfffffffffffffee8,"max_dual_infeasibility",paVar1);
  status0 = debugCompareHighsInfoDouble
                      (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8
                       ,in_stack_fffffffffffffee0);
  local_1c = debugWorseStatus(status0,in_stack_fffffffffffffe80);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffee7);
  return local_1c;
}

Assistant:

HighsDebugStatus debugCompareHighsInfoInfeasibility(
    const HighsOptions& options, const HighsInfo& highs_info0,
    const HighsInfo& highs_info1) {
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  return_status = debugWorseStatus(
      debugCompareHighsInfoInteger("num_primal_infeasibility", options,
                                   highs_info0.num_primal_infeasibilities,
                                   highs_info1.num_primal_infeasibilities),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoDouble("sum_primal_infeasibility", options,
                                  highs_info0.sum_primal_infeasibilities,
                                  highs_info1.sum_primal_infeasibilities),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoDouble("max_primal_infeasibility", options,
                                  highs_info0.max_primal_infeasibility,
                                  highs_info1.max_primal_infeasibility),
      return_status);

  return_status = debugWorseStatus(
      debugCompareHighsInfoInteger("num_dual_infeasibility", options,
                                   highs_info0.num_dual_infeasibilities,
                                   highs_info1.num_dual_infeasibilities),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoDouble("sum_dual_infeasibility", options,
                                  highs_info0.sum_dual_infeasibilities,
                                  highs_info1.sum_dual_infeasibilities),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoDouble("max_dual_infeasibility", options,
                                  highs_info0.max_dual_infeasibility,
                                  highs_info1.max_dual_infeasibility),
      return_status);
  return return_status;
}